

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd_copy.cpp
# Opt level: O0

ON_SubD * __thiscall ON_SubD::operator=(ON_SubD *this,ON_SubD *src)

{
  ON_SubD *src_local;
  ON_SubD *this_local;
  
  if (this != src) {
    Destroy(this);
    CopyHelper(this,src);
    ON_Geometry::operator=(&this->super_ON_Geometry,&src->super_ON_Geometry);
  }
  return this;
}

Assistant:

ON_SubD& ON_SubD::operator=(const ON_SubD& src)
{
  if ( this != &src )
  {
    this->Destroy();
    this->CopyHelper(src);
    // The next line copies user data
    ON_Geometry::operator=(src);
  }
  return *this;
}